

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageReceiver.cpp
# Opt level: O1

bool __thiscall
unixsocketipc::MessageReceiver::receive_message
          (MessageReceiver *this,int client_socket_fd,uint32_t *id,char *buf,uint32_t *size)

{
  ssize_t sVar1;
  uint uVar2;
  size_t __n;
  uint uVar3;
  uint32_t *__buf;
  bool bVar4;
  
  sVar1 = recv(client_socket_fd,id,4,0);
  if ((int)sVar1 < 1) {
    return false;
  }
  uVar3 = 4;
  do {
    uVar3 = uVar3 - (uint)sVar1;
    if (uVar3 == 0) goto LAB_00102716;
    id = (uint32_t *)((long)id + (ulong)((uint)sVar1 & 0x7fffffff));
    sVar1 = recv(client_socket_fd,id,(ulong)uVar3,0);
  } while (0 < (int)sVar1);
  if (uVar3 == 0) {
LAB_00102716:
    sVar1 = recv(client_socket_fd,size,4,0);
    if ((int)sVar1 < 1) {
      return false;
    }
    uVar3 = 4;
    __buf = size;
    do {
      uVar3 = uVar3 - (uint)sVar1;
      if (uVar3 == 0) goto LAB_00102761;
      __buf = (uint32_t *)((long)__buf + (ulong)((uint)sVar1 & 0x7fffffff));
      sVar1 = recv(client_socket_fd,__buf,(ulong)uVar3,0);
    } while (0 < (int)sVar1);
    if (uVar3 == 0) {
LAB_00102761:
      __n = (size_t)*size;
      bVar4 = __n == 0;
      if (bVar4) {
        return bVar4;
      }
      while( true ) {
        sVar1 = recv(client_socket_fd,buf,__n,0);
        uVar3 = (uint)sVar1;
        if ((int)uVar3 < 1) {
          return bVar4;
        }
        uVar2 = (int)__n - uVar3;
        __n = (size_t)uVar2;
        bVar4 = uVar2 == 0;
        if (bVar4) break;
        buf = buf + (uVar3 & 0x7fffffff);
      }
      return bVar4;
    }
  }
  return false;
}

Assistant:

bool MessageReceiver::receive_message(int client_socket_fd, uint32_t &id, char* buf, uint32_t &size ) {
   if (!receive_buffer(client_socket_fd, reinterpret_cast<char*>(&id), sizeof(id)))
      return false;

   if (!receive_buffer(client_socket_fd, reinterpret_cast<char*>(&size), sizeof(size)))
      return false;

   assert(size <= MESSAGE_BUFF_SIZE && "Received message size exceeds reception buffer size!");

   if (!receive_buffer(client_socket_fd, buf, size))
      return false;

   return true;
}